

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_grow_map_(jit_State *J,MSize need)

{
  void *pvVar1;
  GCSize in_ESI;
  void *in_RDI;
  lua_State *unaff_retaddr;
  GCSize in_stack_fffffffffffffff0;
  
  if (in_ESI < (uint)(*(int *)((long)in_RDI + 0x160) << 1)) {
    in_ESI = *(int *)((long)in_RDI + 0x160) << 1;
  }
  else if (in_ESI < 0x40) {
    in_ESI = 0x40;
  }
  pvVar1 = lj_mem_realloc(unaff_retaddr,in_RDI,in_ESI,in_stack_fffffffffffffff0);
  *(void **)((long)in_RDI + 0x158) = pvVar1;
  *(undefined8 *)((long)in_RDI + 0x28) = *(undefined8 *)((long)in_RDI + 0x158);
  *(GCSize *)((long)in_RDI + 0x160) = in_ESI;
  return;
}

Assistant:

void lj_snap_grow_map_(jit_State *J, MSize need)
{
  if (need < 2*J->sizesnapmap)
    need = 2*J->sizesnapmap;
  else if (need < 64)
    need = 64;
  J->snapmapbuf = (SnapEntry *)lj_mem_realloc(J->L, J->snapmapbuf,
		    J->sizesnapmap*sizeof(SnapEntry), need*sizeof(SnapEntry));
  J->cur.snapmap = J->snapmapbuf;
  J->sizesnapmap = need;
}